

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

string * __thiscall re2::RegexpStatus::Text_abi_cxx11_(RegexpStatus *this)

{
  bool bVar1;
  const_pointer pcVar2;
  long in_RSI;
  string *in_RDI;
  string *s;
  RegexpStatusCode in_stack_ffffffffffffffbc;
  string local_38 [39];
  undefined1 local_11;
  
  bVar1 = StringPiece::empty((StringPiece *)(in_RSI + 8));
  if (bVar1) {
    CodeText_abi_cxx11_(in_stack_ffffffffffffffbc);
  }
  else {
    local_11 = 0;
    std::__cxx11::string::string((string *)in_RDI);
    CodeText_abi_cxx11_(in_stack_ffffffffffffffbc);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::append((char *)in_RDI);
    pcVar2 = StringPiece::data((StringPiece *)(in_RSI + 8));
    StringPiece::size((StringPiece *)(in_RSI + 8));
    std::__cxx11::string::append((char *)in_RDI,(ulong)pcVar2);
  }
  return in_RDI;
}

Assistant:

std::string RegexpStatus::Text() const {
  if (error_arg_.empty())
    return CodeText(code_);
  std::string s;
  s.append(CodeText(code_));
  s.append(": ");
  s.append(error_arg_.data(), error_arg_.size());
  return s;
}